

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void wallet::wallet_tests::AddKey(CWallet *wallet,CKey *key)

{
  long lVar1;
  byte bVar2;
  size_type sVar3;
  reference pvVar4;
  ScriptPubKeyMan *this;
  shared_ptr<Descriptor> *in_RSI;
  WalletDescriptor *in_RDI;
  long in_FS_OFFSET;
  value_type *desc;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  WalletDescriptor w_desc;
  string error;
  FlatSigningProvider provider;
  FlatSigningProvider *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  int32_t in_stack_fffffffffffffd10;
  int32_t in_stack_fffffffffffffd14;
  allocator<char> *in_stack_fffffffffffffd18;
  FlatSigningProvider *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  CKey *in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffda7;
  string *in_stack_fffffffffffffda8;
  FlatSigningProvider *in_stack_fffffffffffffdb0;
  WalletDescriptor *in_stack_fffffffffffffdb8;
  CWallet *in_stack_fffffffffffffdc0;
  int32_t next_index;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffcd8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd18,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),in_stack_fffffffffffffd08
             ,in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x18,0));
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffcd8);
  std::__cxx11::string::string(in_stack_fffffffffffffcf0);
  EncodeSecret_abi_cxx11_(in_stack_fffffffffffffd50);
  std::operator+((char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::operator+(in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8);
  Parse(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,(string *)in_RDI,
        SUB81((ulong)in_RSI >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  sVar3 = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::size((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                  *)in_stack_fffffffffffffcd8);
  if (sVar3 != 1) {
    __assert_fail("descs.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x45,"void wallet::wallet_tests::AddKey(CWallet &, const CKey &)");
  }
  pvVar4 = std::
           vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
           ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 *)in_stack_fffffffffffffce8,
                CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
  next_index = (int32_t)((ulong)pvVar4 >> 0x20);
  std::shared_ptr<Descriptor>::shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
            ((shared_ptr<Descriptor> *)in_stack_fffffffffffffcd8,
             (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)0xe26e41);
  WalletDescriptor::WalletDescriptor
            (in_RDI,in_RSI,(uint64_t)in_stack_fffffffffffffd18,in_stack_fffffffffffffd14,
             in_stack_fffffffffffffd10,next_index);
  std::shared_ptr<Descriptor>::~shared_ptr((shared_ptr<Descriptor> *)in_stack_fffffffffffffcd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)in_RSI,in_stack_fffffffffffffd18);
  this = CWallet::AddWalletDescriptor
                   (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                    in_stack_fffffffffffffda8,(bool)in_stack_fffffffffffffda7);
  bVar2 = this != (ScriptPubKeyMan *)0x0 ^ 0xff;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd37);
  if ((bVar2 & 1) == 0) {
    WalletDescriptor::~WalletDescriptor((WalletDescriptor *)in_stack_fffffffffffffcd8);
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
               *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcd8);
    FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffcd8);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffcd8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                ,0x48,"void wallet::wallet_tests::AddKey(CWallet &, const CKey &)");
}

Assistant:

static void AddKey(CWallet& wallet, const CKey& key)
{
    LOCK(wallet.cs_wallet);
    FlatSigningProvider provider;
    std::string error;
    auto descs = Parse("combo(" + EncodeSecret(key) + ")", provider, error, /* require_checksum=*/ false);
    assert(descs.size() == 1);
    auto& desc = descs.at(0);
    WalletDescriptor w_desc(std::move(desc), 0, 0, 1, 1);
    if (!wallet.AddWalletDescriptor(w_desc, provider, "", false)) assert(false);
}